

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::param::Chart::evaluateQuality(Chart *this,UniformGrid2 *boundaryGrid)

{
  UniformGrid2 *boundaryGrid_local;
  Chart *this_local;
  
  Quality::computeBoundaryIntersection(&this->m_quality,this->m_unifiedMesh,boundaryGrid);
  Quality::computeFlippedFaces
            (&this->m_quality,this->m_unifiedMesh,this->m_initialFaceCount,
             (Array<unsigned_int> *)0x0);
  return;
}

Assistant:

void evaluateQuality(UniformGrid2 &boundaryGrid)
	{
		XA_PROFILE_START(parameterizeChartsEvaluateQuality)
		m_quality.computeBoundaryIntersection(m_unifiedMesh, boundaryGrid);
#if XA_DEBUG_EXPORT_OBJ_INVALID_PARAMETERIZATION
		m_quality.computeFlippedFaces(m_unifiedMesh, m_initialFaceCount, &m_paramFlippedFaces);
#else
		m_quality.computeFlippedFaces(m_unifiedMesh, m_initialFaceCount, nullptr);
#endif
		// Don't need to call computeMetrics here, that's only used in evaluateOrthoQuality to determine if quality is acceptable enough to use ortho projection.
		XA_PROFILE_END(parameterizeChartsEvaluateQuality)
	}